

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  float local_30;
  unsigned_short local_2a;
  uint index_size;
  bool overwrite_dst_local;
  ImWchar src_local;
  ImWchar dst_local;
  ImFont *this_local;
  
  if ((this->IndexLookup).Size < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0xab0,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  uVar1 = (this->IndexLookup).Size;
  if ((((uVar1 <= dst) || ((this->IndexLookup).Data[dst] != 0xffff)) || (overwrite_dst)) &&
     ((src < uVar1 || (dst < uVar1)))) {
    GrowIndex(this,dst + 1);
    if (src < uVar1) {
      local_2a = (this->IndexLookup).Data[src];
    }
    else {
      local_2a = 0xffff;
    }
    puVar2 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)dst);
    *puVar2 = local_2a;
    if (src < uVar1) {
      local_30 = (this->IndexAdvanceX).Data[src];
    }
    else {
      local_30 = 1.0;
    }
    pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,(uint)dst);
    *pfVar3 = local_30;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}